

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O0

void zmMontCreate(qr_o *r,octet *mod,size_t no,size_t l,void *stack)

{
  u64 uVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t in_RCX;
  long in_RDX;
  long *in_RDI;
  size_t unaff_retaddr;
  word *in_stack_00000008;
  size_t in_stack_00000010;
  word *in_stack_00000018;
  void *in_stack_ffffffffffffffb8;
  u64 *in_stack_ffffffffffffffc0;
  
  in_RDI[6] = in_RDX + 7U >> 3;
  in_RDI[7] = in_RDX;
  in_RDI[3] = (long)(in_RDI + 0x12);
  u64From(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0x16b0a2);
  in_RDI[4] = in_RDI[3] + in_RDI[6] * 8;
  wwSetZero((word *)in_RDI[4],in_RDI[6]);
  if (in_RCX == in_RDI[6] << 6) {
    zzSub2((word *)in_RDI[4],(word *)in_RDI[3],in_RDI[6]);
  }
  else {
    wwSetBit((word *)in_RDI[4],in_RCX,1);
  }
  zzMod((word *)stack,in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI);
  in_RDI[5] = in_RDI[4] + in_RDI[6] * 8;
  uVar1 = u64NegInv(*(u64 *)in_RDI[3]);
  *(u64 *)in_RDI[5] = uVar1;
  *(size_t *)(in_RDI[5] + 8) = in_RCX;
  in_RDI[8] = (long)zmFrom;
  in_RDI[9] = (long)zmTo;
  in_RDI[10] = (long)zmAdd2;
  in_RDI[0xb] = (long)zmSub2;
  in_RDI[0xc] = (long)zmNeg2;
  in_RDI[0xd] = (long)zmMulMont2;
  in_RDI[0xe] = (long)zmSqrMont2;
  in_RDI[0xf] = (long)zmInvMont2;
  in_RDI[0x10] = (long)zmDivMont2;
  sVar2 = zmMulMont2_deep((size_t)in_stack_ffffffffffffffc0);
  sVar3 = zmSqrMont2_deep(sVar2);
  sVar4 = zmInvMont2_deep(0x16b27e);
  sVar5 = zmDivMont2_deep(sVar2);
  sVar2 = utilMax(4,sVar2,sVar3,sVar4,sVar5);
  in_RDI[0x11] = sVar2;
  *in_RDI = in_RDI[6] * 0x10 + 0xa0;
  in_RDI[1] = 3;
  in_RDI[2] = 0;
  return;
}

Assistant:

void zmMontCreate(qr_o* r, const octet mod[], size_t no, size_t l, void* stack)
{
	ASSERT(memIsValid(r, sizeof(qr_o)));
	ASSERT(memIsValid(mod, no));
	ASSERT(no > 0 && mod[no - 1] > 0);
	ASSERT(mod[0] % 2 != 0);
	// зафиксировать размерности
	r->n = W_OF_O(no);
	r->no = no;
	// зафиксировать модуль
	r->mod = (word*)r->descr;
	wwFrom(r->mod, mod, no);
	ASSERT(wwBitSize(r->mod, r->n) <= l && B_OF_W(r->n) >= l);
	// подготовить единицу: unity <- R \mod mod
	r->unity = r->mod + r->n;
	wwSetZero(r->unity, r->n);
	if (l == B_OF_W(r->n))
		zzSub2(r->unity, r->mod, r->n);
	else
		wwSetBit(r->unity, l, 1);
	zzMod(r->unity, r->unity, r->n, r->mod, r->n, stack);
	// подготовить параметры
	r->params = r->unity + r->n;
	((zm_mont_params_st*)r->params)->m0 = wordNegInv(r->mod[0]);
	((zm_mont_params_st*)r->params)->l = l;
	// настроить функции
	r->from = zmFrom;
	r->to = zmTo;
	r->add = zmAdd2;
	r->sub = zmSub2;
	r->neg = zmNeg2;
	r->mul = zmMulMont2;
	r->sqr = zmSqrMont2;
	r->inv = zmInvMont2;
	r->div = zmDivMont2;
	r->deep = utilMax(4,
		zmMulMont2_deep(r->n),
		zmSqrMont2_deep(r->n),
		zmInvMont2_deep(r->n),
		zmDivMont2_deep(r->n));
	// настроить заголовок
	r->hdr.keep = sizeof(qr_o) + O_OF_W(2 * r->n) + sizeof(zm_mont_params_st);
	r->hdr.p_count = 3;
	r->hdr.o_count = 0;
}